

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

void net_uv::TCPSocket::server_on_after_new_connection(uv_stream_t *server,int32_t status)

{
  void *pvVar1;
  char *pcVar2;
  undefined4 local_c;
  uv_stream_t *local_8;
  
  if (status != 0) {
    pcVar2 = uv_strerror(status);
    net_uvLog(3,"tcp new connection error %s",pcVar2);
    return;
  }
  pvVar1 = server->data;
  local_c = 0;
  local_8 = server;
  if (*(long *)((long)pvVar1 + 0xb8) != 0) {
    (**(code **)((long)pvVar1 + 0xc0))((long)pvVar1 + 0xa8,&local_8,&local_c);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void TCPSocket::server_on_after_new_connection(uv_stream_t *server, int32_t status) 
{
	if (status != 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "tcp new connection error %s", uv_strerror(status));
		return;
	}
	TCPSocket* s = (TCPSocket*)server->data;
	s->m_newConnectionCall(server, status);
}